

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::doJSON(QPDFJob *this,QPDF *pdf,Pipeline *p)

{
  undefined1 *puVar1;
  size_t sVar2;
  undefined8 uVar3;
  ulong uVar4;
  const_iterator cVar5;
  Pipeline *this_00;
  element_type *peVar6;
  Pl_String *pPVar7;
  bool bVar8;
  bool first;
  string decode_level_str;
  JSON schema;
  JSON j_params;
  string captured_json;
  bool local_e1;
  undefined1 local_e0 [16];
  undefined1 local_d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Pipeline *local_a8 [2];
  Pl_String *local_98;
  string local_90;
  JSON local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  JSON local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_d0._16_8_ = p;
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      test_json_schema == true) {
    local_e0._0_8_ = (Pl_String *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_String,std::allocator<Pl_String>,char_const(&)[13],Pipeline*&,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8),(Pl_String **)local_e0,
               (allocator<Pl_String> *)(local_d0 + 0x18),(char (*) [13])"capture json",
               (Pipeline **)(local_d0 + 0x10),&local_60);
    local_98 = (Pl_String *)local_e0._8_8_;
    local_d0._16_8_ = local_e0._0_8_;
  }
  else {
    local_98 = (Pl_String *)0x0;
  }
  local_e1 = true;
  JSON::writeDictionaryOpen((Pipeline *)local_d0._16_8_,&local_e1,0);
  uVar3 = local_d0._16_8_;
  peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6->json_output == false) {
    local_e0._0_8_ = (Pl_String *)local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"version","");
    JSON::makeInt((JSON *)(local_d0 + 0x18),
                  (long)((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->json_version);
    JSON::writeDictionaryItem
              ((Pipeline *)uVar3,&local_e1,(string *)local_e0,(JSON *)(local_d0 + 0x18),1);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    if ((Pl_String *)local_e0._0_8_ != (Pl_String *)local_d0) {
      operator_delete((void *)local_e0._0_8_,local_d0._0_8_ + 1);
    }
    JSON::makeDictionary();
    local_e0._8_8_ = (Pl_String *)0x0;
    local_d0._0_8_ = local_d0._0_8_ & 0xffffffffffffff00;
    uVar4 = (ulong)((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->decode_level;
    local_e0._0_8_ = (Pl_String *)local_d0;
    if (uVar4 < 4) {
      std::__cxx11::string::_M_replace
                ((ulong)local_e0,0,(char *)0x0,
                 (ulong)(&DAT_0026c750 + *(int *)(&DAT_0026c750 + uVar4 * 4)));
    }
    puVar1 = local_d0 + 0x28;
    local_b8._M_allocated_capacity = (size_type)puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_d0 + 0x18),"decodelevel","");
    JSON::makeString((JSON *)&local_90.field_2,(string *)local_e0);
    JSON::addDictionaryMember(&local_40,&local_90,(JSON *)(local_d0 + 0x18));
    if (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.field_2._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.field_2._8_8_);
    }
    if ((undefined1 *)local_b8._M_allocated_capacity != puVar1) {
      operator_delete((void *)local_b8._M_allocated_capacity,
                      (ulong)((long)&local_a8[0]->_vptr_Pipeline + 1));
    }
    uVar3 = local_d0._16_8_;
    local_b8._M_allocated_capacity = (size_type)puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_d0 + 0x18),"parameters","");
    JSON::writeDictionaryItem
              ((Pipeline *)uVar3,&local_e1,(string *)(local_d0 + 0x18),(JSON *)&local_90,1);
    if ((undefined1 *)local_b8._M_allocated_capacity != puVar1) {
      operator_delete((void *)local_b8._M_allocated_capacity,
                      (ulong)((long)&local_a8[0]->_vptr_Pipeline + 1));
    }
    if ((Pl_String *)local_e0._0_8_ != (Pl_String *)local_d0) {
      operator_delete((void *)local_e0._0_8_,local_d0._0_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length);
    }
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  sVar2 = *(size_t *)((long)&(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header + 0x20);
  if (sVar2 == 0) {
LAB_0018918d:
    doJSONPages(this,(Pipeline *)local_d0._16_8_,&local_e1,pdf);
    if (sVar2 != 0) goto LAB_001891a7;
LAB_00189202:
    doJSONPageLabels(this,(Pipeline *)local_d0._16_8_,&local_e1,pdf);
    if (sVar2 != 0) goto LAB_0018921c;
LAB_00189277:
    pPVar7 = (Pl_String *)this;
    doJSONAcroform(this,(Pipeline *)local_d0._16_8_,&local_e1,pdf);
    if (sVar2 != 0) goto LAB_00189291;
LAB_001892ec:
    doJSONAttachments((QPDFJob *)pPVar7,(Pipeline *)local_d0._16_8_,&local_e1,pdf);
    if (sVar2 != 0) goto LAB_00189303;
LAB_0018935e:
    doJSONEncrypt(this,(Pipeline *)local_d0._16_8_,&local_e1,pdf);
    if (sVar2 != 0) goto LAB_00189378;
LAB_001893d3:
    doJSONOutlines(this,(Pipeline *)local_d0._16_8_,&local_e1,pdf);
    if (sVar2 != 0) goto LAB_001893f1;
LAB_001894a9:
    doJSONObjects(this,(Pipeline *)local_d0._16_8_,&local_e1,pdf);
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar6->json_version != 1) goto LAB_0018954e;
    if (sVar2 != 0) goto LAB_001894e1;
  }
  else {
    local_e0._0_8_ = (Pl_String *)local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"pages","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar6->json_keys)._M_t,(key_type *)local_e0);
    if ((Pl_String *)local_e0._0_8_ != (Pl_String *)local_d0) {
      operator_delete((void *)local_e0._0_8_,local_d0._0_8_ + 1);
    }
    if (cVar5._M_node != &(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header)
    goto LAB_0018918d;
LAB_001891a7:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e0._0_8_ = (Pl_String *)local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"pagelabels","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar6->json_keys)._M_t,(key_type *)local_e0);
    if ((Pl_String *)local_e0._0_8_ != (Pl_String *)local_d0) {
      operator_delete((void *)local_e0._0_8_,local_d0._0_8_ + 1);
    }
    if (cVar5._M_node != &(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header)
    goto LAB_00189202;
LAB_0018921c:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e0._0_8_ = (Pl_String *)local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"acroform","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar6->json_keys)._M_t,(key_type *)local_e0);
    if ((Pl_String *)local_e0._0_8_ != (Pl_String *)local_d0) {
      operator_delete((void *)local_e0._0_8_,local_d0._0_8_ + 1);
    }
    if (cVar5._M_node != &(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header)
    goto LAB_00189277;
LAB_00189291:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e0._0_8_ = (Pl_String *)local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"attachments","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar6->json_keys)._M_t,(key_type *)local_e0);
    pPVar7 = (Pl_String *)local_e0._0_8_;
    if ((Pl_String *)local_e0._0_8_ != (Pl_String *)local_d0) {
      operator_delete((void *)local_e0._0_8_,local_d0._0_8_ + 1);
    }
    if (cVar5._M_node != &(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header)
    goto LAB_001892ec;
LAB_00189303:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e0._0_8_ = (Pl_String *)local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"encrypt","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar6->json_keys)._M_t,(key_type *)local_e0);
    if ((Pl_String *)local_e0._0_8_ != (Pl_String *)local_d0) {
      operator_delete((void *)local_e0._0_8_,local_d0._0_8_ + 1);
    }
    if (cVar5._M_node != &(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header)
    goto LAB_0018935e;
LAB_00189378:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e0._0_8_ = (Pl_String *)local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"outlines","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar6->json_keys)._M_t,(key_type *)local_e0);
    if ((Pl_String *)local_e0._0_8_ != (Pl_String *)local_d0) {
      operator_delete((void *)local_e0._0_8_,local_d0._0_8_ + 1);
    }
    if (cVar5._M_node != &(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header)
    goto LAB_001893d3;
LAB_001893f1:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e0._0_8_ = (Pl_String *)local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"objects","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar6->json_keys)._M_t,(key_type *)local_e0);
    bVar8 = true;
    if (cVar5._M_node == &(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header) {
      peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_b8._M_allocated_capacity = (size_type)(local_d0 + 0x28);
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_d0 + 0x18),"qpdf","");
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(peVar6->json_keys)._M_t,(key_type *)(local_d0 + 0x18));
      bVar8 = cVar5._M_node != &(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
      if ((undefined1 *)local_b8._M_allocated_capacity != local_d0 + 0x28) {
        operator_delete((void *)local_b8._M_allocated_capacity,
                        (ulong)((long)&local_a8[0]->_vptr_Pipeline + 1));
      }
    }
    if ((Pl_String *)local_e0._0_8_ != (Pl_String *)local_d0) {
      operator_delete((void *)local_e0._0_8_,local_d0._0_8_ + 1);
    }
    if (bVar8) goto LAB_001894a9;
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar6->json_version != 1) goto LAB_0018954e;
LAB_001894e1:
    local_e0._0_8_ = (Pl_String *)local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"objectinfo","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar6->json_keys)._M_t,(key_type *)local_e0);
    if ((Pl_String *)local_e0._0_8_ != (Pl_String *)local_d0) {
      operator_delete((void *)local_e0._0_8_,local_d0._0_8_ + 1);
    }
    if (cVar5._M_node == &(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header)
    goto LAB_0018954e;
  }
  doJSONObjectinfo(this,(Pipeline *)local_d0._16_8_,&local_e1,pdf);
LAB_0018954e:
  JSON::writeDictionaryClose((Pipeline *)local_d0._16_8_,local_e1,0);
  Pipeline::operator<<((Pipeline *)local_d0._16_8_,"\n");
  peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6->test_json_schema == true) {
    json_schema((QPDFJob *)(local_d0 + 0x18),peVar6->json_version,&peVar6->json_keys);
    local_e0._0_8_ = local_e0;
    local_d0._0_8_ = (_func_int **)0x0;
    local_e0._8_8_ = local_e0._0_8_;
    JSON::parse((JSON *)&local_90,&local_60);
    local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b8._M_allocated_capacity;
    local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
      }
    }
    bVar8 = JSON::checkSchema((JSON *)&local_90,&local_70,
                              (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_e0);
    if (local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((!bVar8) &&
       (QPDFLogger::error((((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          "QPDFJob didn\'t create JSON that complies with its own rules.\n"),
       (Pl_String *)local_e0._0_8_ != (Pl_String *)local_e0)) {
      pPVar7 = (Pl_String *)local_e0._0_8_;
      do {
        QPDFLogger::getError
                  ((QPDFLogger *)&local_90.field_2,
                   SUB81((((this->m).
                           super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                  );
        this_00 = Pipeline::operator<<
                            ((Pipeline *)local_90.field_2._M_allocated_capacity,
                             (string *)&(pPVar7->super_Pipeline).identifier._M_string_length);
        Pipeline::operator<<(this_00,"\n");
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.field_2._8_8_);
        }
        pPVar7 = (Pl_String *)
                 (((_List_impl *)&(pPVar7->super_Pipeline)._vptr_Pipeline)->_M_node).
                 super__List_node_base._M_next;
      } while (pPVar7 != (Pl_String *)local_e0);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_e0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
  }
  if (local_98 != (Pl_String *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
QPDFJob::doJSON(QPDF& pdf, Pipeline* p)
{
    // qpdf guarantees that no new top-level keys whose names start with "x-" will be added. These
    // are reserved for users.

    std::string captured_json;
    std::shared_ptr<Pl_String> pl_str;
    if (m->test_json_schema) {
        pl_str = std::make_shared<Pl_String>("capture json", p, captured_json);
        p = pl_str.get();
    }

    bool first = true;
    JSON::writeDictionaryOpen(p, first, 0);

    if (m->json_output) {
        // Exclude version and parameters to keep the output file minimal. The JSON version is
        // inside the "qpdf" key for version 2.
    } else {
        // This version is updated every time a non-backward-compatible change is made to the JSON
        // format. Clients of the JSON are to ignore unrecognized keys, so we only update the
        // version of a key disappears or if its value changes meaning.
        JSON::writeDictionaryItem(p, first, "version", JSON::makeInt(m->json_version), 1);
        JSON j_params = JSON::makeDictionary();
        std::string decode_level_str;
        switch (m->decode_level) {
        case qpdf_dl_none:
            decode_level_str = "none";
            break;
        case qpdf_dl_generalized:
            decode_level_str = "generalized";
            break;
        case qpdf_dl_specialized:
            decode_level_str = "specialized";
            break;
        case qpdf_dl_all:
            decode_level_str = "all";
            break;
        }
        j_params.addDictionaryMember("decodelevel", JSON::makeString(decode_level_str));
        JSON::writeDictionaryItem(p, first, "parameters", j_params, 1);
    }
    bool all_keys = m->json_keys.empty();
    // The list of selectable top-level keys id duplicated in the following places: job.yml,
    // QPDFJob::json_schema, and QPDFJob::doJSON.

    // We do pages and pagelabels first since they have the side effect of repairing the pages tree,
    // which could potentially impact object references in remaining items.
    if (all_keys || m->json_keys.count("pages")) {
        doJSONPages(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("pagelabels")) {
        doJSONPageLabels(p, first, pdf);
    }

    // The non-special keys are output in alphabetical order, but the order doesn't actually matter.
    if (all_keys || m->json_keys.count("acroform")) {
        doJSONAcroform(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("attachments")) {
        doJSONAttachments(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("encrypt")) {
        doJSONEncrypt(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("outlines")) {
        doJSONOutlines(p, first, pdf);
    }

    // We do objects last so their information is consistent with repairing the page tree. To see
    // the original file with any page tree problems and the page tree not flattened, select
    // qpdf/objects/objectinfo without other keys.
    if (all_keys || m->json_keys.count("objects") || m->json_keys.count("qpdf")) {
        doJSONObjects(p, first, pdf);
    }
    if (m->json_version == 1) {
        // "objectinfo" is not needed for version >1 since you can tell streams from other objects
        // in "objects".
        if (all_keys || m->json_keys.count("objectinfo")) {
            doJSONObjectinfo(p, first, pdf);
        }
    }

    JSON::writeDictionaryClose(p, first, 0);
    *p << "\n";

    if (m->test_json_schema) {
        // Check against schema
        JSON schema = json_schema(m->json_version, &m->json_keys);
        std::list<std::string> errors;
        JSON captured = JSON::parse(captured_json);
        if (!captured.checkSchema(schema, errors)) {
            m->log->error("QPDFJob didn't create JSON that complies with its own rules.\n");
            for (auto const& error: errors) {
                *m->log->getError() << error << "\n";
            }
        }
    }
}